

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_spy_ImportWriteProtection.cpp
# Opt level: O0

bool axl::spy::disableImportWriteProtection(void *module,ImportWriteProtectionBackup *backup)

{
  size_t sVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  Module *this;
  SystemInfo *pSVar6;
  int *piVar7;
  ulong uVar8;
  ulong *in_RSI;
  long *in_RDI;
  int result;
  size_t end;
  size_t begin;
  Elf64_Phdr *phdr;
  size_t i;
  link_map_full *linkMap;
  size_t pageSize;
  ulong local_30;
  
  this = g::getModule();
  pSVar6 = g::Module::getSystemInfo(this);
  sVar1 = pSVar6->m_pageSize;
  local_30 = 0;
  while( true ) {
    if (*(ushort *)(in_RDI + 0x57) <= local_30) {
      *in_RSI = 0;
      in_RSI[1] = 0;
      *(undefined4 *)(in_RSI + 2) = 0;
      return true;
    }
    piVar7 = (int *)(in_RDI[0x55] + local_30 * 0x38);
    if (*piVar7 == 0x6474e552) break;
    local_30 = local_30 + 1;
  }
  lVar2 = *in_RDI;
  lVar3 = *(long *)(piVar7 + 4);
  lVar4 = *(long *)(piVar7 + 10);
  uVar8 = (sVar1 - 1 ^ 0xffffffffffffffff) & lVar2 + lVar3;
  *in_RSI = uVar8;
  in_RSI[1] = ((lVar2 + lVar3 + lVar4 + sVar1) - 1 & (sVar1 - 1 ^ 0xffffffffffffffff)) - uVar8;
  *(int *)(in_RSI + 2) = piVar7[1];
  iVar5 = mprotect((void *)*in_RSI,in_RSI[1],7);
  return iVar5 != -1;
}

Assistant:

bool
disableImportWriteProtection(
	void* module,
	ImportWriteProtectionBackup* backup
) {
	size_t pageSize = g::getModule()->getSystemInfo()->m_pageSize;

	link_map_full* linkMap = (link_map_full*)module;
	for (size_t i = 0; i < linkMap->l_phnum; i++) {
		const ElfW(Phdr)* phdr = &linkMap->l_phdr[i];
		if (phdr->p_type != PT_GNU_RELRO) // read-only-after-relocation (contains GOT)
			continue;

		size_t begin = linkMap->l_addr + phdr->p_vaddr;
		size_t end = begin + phdr->p_memsz;

		begin &= ~(pageSize - 1);
		end = (end + pageSize - 1) & ~(pageSize - 1);

		backup->m_p = (char*)begin;
		backup->m_size = end - begin;
		backup->m_flags = phdr->p_flags;

		int result = ::mprotect(backup->m_p, backup->m_size, PROT_READ | PROT_WRITE | PROT_EXEC);
		return result != -1;
	}

	// GOT not found, still OK

	backup->m_p = NULL;
	backup->m_size = 0;
	backup->m_flags = 0;
	return true;
}